

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O1

void __thiscall
chrono::ChAssembly::IntStateIncrement
          (ChAssembly *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  pointer psVar5;
  element_type *peVar6;
  pointer psVar7;
  element_type *peVar8;
  pointer psVar9;
  element_type *peVar10;
  int iVar11;
  shared_ptr<chrono::fea::ChMesh> *mesh;
  pointer psVar12;
  int iVar13;
  int iVar14;
  shared_ptr<chrono::ChBody> *body;
  pointer psVar15;
  pointer psVar16;
  pointer psVar17;
  pointer psVar18;
  
  iVar14 = off_x - (this->super_ChPhysicsItem).offset_x;
  iVar13 = off_v - (this->super_ChPhysicsItem).offset_w;
  psVar1 = (this->bodylist).
           super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar15 = (this->bodylist).
                 super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar15 != psVar1; psVar15 = psVar15 + 1
      ) {
    iVar11 = (*(((psVar15->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar2 = (psVar15->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar2->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x21])
                (peVar2,(ulong)((peVar2->super_ChPhysicsItem).offset_x + iVar14),x_new,x,
                 (ulong)((peVar2->super_ChPhysicsItem).offset_w + iVar13),Dv);
    }
  }
  psVar3 = (this->shaftlist).
           super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar16 = (this->shaftlist).
                 super__Vector_base<std::shared_ptr<chrono::ChShaft>,_std::allocator<std::shared_ptr<chrono::ChShaft>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar16 != psVar3; psVar16 = psVar16 + 1
      ) {
    iVar11 = (*(((psVar16->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar4 = (psVar16->super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar4->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x21])
                (peVar4,(ulong)((peVar4->super_ChPhysicsItem).offset_x + iVar14),x_new,x,
                 (ulong)((peVar4->super_ChPhysicsItem).offset_w + iVar13),Dv);
    }
  }
  psVar5 = (this->linklist).
           super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar17 = (this->linklist).
                 super__Vector_base<std::shared_ptr<chrono::ChLinkBase>,_std::allocator<std::shared_ptr<chrono::ChLinkBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar17 != psVar5; psVar17 = psVar17 + 1
      ) {
    iVar11 = (*(((psVar17->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ChPhysicsItem).super_ChObj._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar6 = (psVar17->super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      (*(peVar6->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x21])
                (peVar6,(ulong)((peVar6->super_ChPhysicsItem).offset_x + iVar14),x_new,x,
                 (ulong)((peVar6->super_ChPhysicsItem).offset_w + iVar13),Dv);
    }
  }
  psVar7 = (this->meshlist).
           super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar12 = (this->meshlist).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChMesh>,_std::allocator<std::shared_ptr<chrono::fea::ChMesh>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar12 != psVar7; psVar12 = psVar12 + 1
      ) {
    peVar8 = (psVar12->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*(peVar8->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x21])
              (peVar8,(ulong)((peVar8->super_ChIndexedNodes).super_ChPhysicsItem.offset_x + iVar14),
               x_new,x,(ulong)((peVar8->super_ChIndexedNodes).super_ChPhysicsItem.offset_w + iVar13)
               ,Dv);
  }
  psVar9 = (this->otherphysicslist).
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar18 = (this->otherphysicslist).
                 super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; psVar18 != psVar9; psVar18 = psVar18 + 1
      ) {
    iVar11 = (*(((psVar18->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ChObj)._vptr_ChObj[9])();
    if ((char)iVar11 != '\0') {
      peVar10 = (psVar18->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      (*(peVar10->super_ChObj)._vptr_ChObj[0x21])
                (peVar10,(ulong)(peVar10->offset_x + iVar14),x_new,x,
                 (ulong)(peVar10->offset_w + iVar13),Dv);
    }
  }
  return;
}

Assistant:

void ChAssembly::IntStateIncrement(const unsigned int off_x,
                                   ChState& x_new,
                                   const ChState& x,
                                   const unsigned int off_v,
                                   const ChStateDelta& Dv) {
    unsigned int displ_x = off_x - this->offset_x;
    unsigned int displ_v = off_v - this->offset_w;

    for (auto& body : bodylist) {
        if (body->IsActive())
            body->IntStateIncrement(displ_x + body->GetOffset_x(), x_new, x, displ_v + body->GetOffset_w(), Dv);
    }

    for (auto& shaft : shaftlist) {
        if (shaft->IsActive())
            shaft->IntStateIncrement(displ_x + shaft->GetOffset_x(), x_new, x, displ_v + shaft->GetOffset_w(), Dv);
    }

    for (auto& link : linklist) {
        if (link->IsActive())
            link->IntStateIncrement(displ_x + link->GetOffset_x(), x_new, x, displ_v + link->GetOffset_w(), Dv);
    }

    for (auto& mesh : meshlist) {
        mesh->IntStateIncrement(displ_x + mesh->GetOffset_x(), x_new, x, displ_v + mesh->GetOffset_w(), Dv);
    }

    for (auto& item : otherphysicslist) {
        if (item->IsActive())
            item->IntStateIncrement(displ_x + item->GetOffset_x(), x_new, x, displ_v + item->GetOffset_w(), Dv);
    }
}